

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# muhash.cpp
# Opt level: O2

void __thiscall Num3072::Divide(Num3072 *this,Num3072 *a)

{
  bool bVar1;
  long in_FS_OFFSET;
  Num3072 b;
  Num3072 local_320;
  Num3072 local_1a0;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = IsOverflow(this);
  if (bVar1) {
    FullReduce(this);
  }
  SetToOne(&local_1a0);
  bVar1 = IsOverflow(a);
  if (bVar1) {
    memcpy(&local_320,a,0x180);
    FullReduce(&local_320);
    a = &local_320;
  }
  GetInverse(&local_1a0,a);
  Multiply(this,&local_1a0);
  bVar1 = IsOverflow(this);
  if (bVar1) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      FullReduce(this);
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void Num3072::Divide(const Num3072& a)
{
    if (this->IsOverflow()) this->FullReduce();

    Num3072 inv{};
    if (a.IsOverflow()) {
        Num3072 b = a;
        b.FullReduce();
        inv = b.GetInverse();
    } else {
        inv = a.GetInverse();
    }

    this->Multiply(inv);
    if (this->IsOverflow()) this->FullReduce();
}